

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

string * __thiscall
testing::internal::
DefaultParamName<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase*(*)()>
          (string *__return_storage_ptr__,internal *this,
          TestParamInfo<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
          *info)

{
  TestParamInfo<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*(*)()>
  *info_local;
  
  std::__cxx11::to_string(__return_storage_ptr__,*(unsigned_long *)(this + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  return std::to_string(info.index);
}